

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

FxExpression * __thiscall FxSoundCast::Resolve(FxSoundCast *this,FCompileContext *ctx)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  MetaClass *pMVar3;
  FxConstant *this_00;
  FxExpression *size;
  undefined1 local_58 [24];
  FxConstant *local_40;
  FxExpression *x_1;
  ExpVal constval;
  FxExpression *x;
  FCompileContext *ctx_local;
  FxSoundCast *this_local;
  
  this_local = this;
  if (((this->super_FxExpression).isresolved & 1U) == 0) {
    (this->super_FxExpression).isresolved = true;
    if (this->basex != (FxExpression *)0x0) {
      iVar1 = (*this->basex->_vptr_FxExpression[2])(this->basex,ctx);
      this->basex = (FxExpression *)CONCAT44(extraout_var,iVar1);
    }
    if (this->basex == (FxExpression *)0x0) {
      if (this != (FxSoundCast *)0x0) {
        (*(this->super_FxExpression)._vptr_FxExpression[1])();
      }
      this_local = (FxSoundCast *)0x0;
    }
    else if ((this->basex->ValueType == (PType *)TypeSound) ||
            (pMVar3 = PType::GetClass(this->basex->ValueType),
            pMVar3 == (MetaClass *)PInt::RegistrationInfo.MyClass)) {
      constval.field_1 = (anon_union_8_3_addc324a_for_ExpVal_1)this->basex;
      *(PSound **)((long)constval.field_1.pointer + 0x18) = TypeSound;
      this->basex = (FxExpression *)0x0;
      if (this != (FxSoundCast *)0x0) {
        (*(this->super_FxExpression)._vptr_FxExpression[1])();
      }
      this_local = (FxSoundCast *)constval.field_1.pointer;
    }
    else if (this->basex->ValueType == (PType *)TypeString) {
      uVar2 = (*this->basex->_vptr_FxExpression[3])();
      if ((uVar2 & 1) != 0) {
        size = this->basex;
        FxConstant::GetValue((FxConstant *)&x_1);
        this_00 = (FxConstant *)FxExpression::operator_new((FxExpression *)0x38,(size_t)size);
        ExpVal::GetString((ExpVal *)local_58);
        FSoundID::FSoundID((FSoundID *)(local_58 + 8),(FString *)local_58);
        FxConstant::FxConstant
                  (this_00,(FSoundID *)(local_58 + 8),&(this->super_FxExpression).ScriptPosition);
        FString::~FString((FString *)local_58);
        local_40 = this_00;
        if (this != (FxSoundCast *)0x0) {
          (*(this->super_FxExpression)._vptr_FxExpression[1])();
        }
        this_local = (FxSoundCast *)local_40;
        ExpVal::~ExpVal((ExpVal *)&x_1);
      }
    }
    else {
      FScriptPosition::Message
                (&(this->super_FxExpression).ScriptPosition,2,"Cannot convert to sound");
      if (this != (FxSoundCast *)0x0) {
        (*(this->super_FxExpression)._vptr_FxExpression[1])();
      }
      this_local = (FxSoundCast *)0x0;
    }
  }
  return &this_local->super_FxExpression;
}

Assistant:

FxExpression *FxSoundCast::Resolve(FCompileContext &ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE(basex, ctx);

	if (basex->ValueType == TypeSound || basex->ValueType->GetClass() == RUNTIME_CLASS(PInt))
	{
		FxExpression *x = basex;
		x->ValueType = TypeSound;
		basex = nullptr;
		delete this;
		return x;
	}
	else if (basex->ValueType == TypeString)
	{
		if (basex->isConstant())
		{
			ExpVal constval = static_cast<FxConstant *>(basex)->GetValue();
			FxExpression *x = new FxConstant(FSoundID(constval.GetString()), ScriptPosition);
			delete this;
			return x;
		}
		return this;
	}
	else
	{
		ScriptPosition.Message(MSG_ERROR, "Cannot convert to sound");
		delete this;
		return nullptr;
	}
}